

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_dictContentType_e dictContentType;
  void *dict;
  ZSTD_CDict *cdict;
  size_t sVar1;
  long lVar2;
  ZSTD_CCtx_params *pZVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  size_t srcSizeHint;
  byte bVar6;
  ZSTD_CCtx_params in_stack_fffffffffffffeb8;
  undefined1 local_b0 [128];
  
  bVar6 = 0;
  sVar1 = 0xffffffffffffffff;
  if ((output->pos <= output->size) && (input->pos <= input->size)) {
    if (cctx->streamStage == zcss_init) {
      pZVar3 = &cctx->requestedParams;
      puVar4 = (undefined8 *)local_b0;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *(undefined8 *)pZVar3;
        pZVar3 = (ZSTD_CCtx_params *)&(pZVar3->cParams).chainLog;
        puVar4 = puVar4 + 1;
      }
      dict = (cctx->prefixDict).dict;
      sVar1 = (cctx->prefixDict).dictSize;
      dictContentType = (cctx->prefixDict).dictContentType;
      (cctx->prefixDict).dict = (void *)0x0;
      (cctx->prefixDict).dictSize = 0;
      *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
      if (endOp == ZSTD_e_end) {
        srcSizeHint = input->size;
        cctx->pledgedSrcSizePlusOne = srcSizeHint + 1;
      }
      else {
        srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
      }
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_compressionParameters *)(local_b0 + 4),&cctx->requestedParams,srcSizeHint,0);
      cdict = cctx->cdict;
      puVar4 = (undefined8 *)local_b0;
      puVar5 = (undefined8 *)&stack0xfffffffffffffeb8;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      sVar1 = ZSTD_resetCStream_internal
                        (cctx,dict,sVar1,dictContentType,cdict,in_stack_fffffffffffffeb8,srcSizeHint
                        );
      if (0xffffffffffffff88 < sVar1) {
        return sVar1;
      }
    }
    sVar1 = ZSTD_compressStream_generic(cctx,output,input,endOp);
    if (sVar1 < 0xffffffffffffff89) {
      sVar1 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    if (output->pos > output->size) return ERROR(GENERIC);
    if (input->pos  > input->size)  return ERROR(GENERIC);
    assert(cctx!=NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        ZSTD_CCtx_params params = cctx->requestedParams;
        ZSTD_prefixDict const prefixDict = cctx->prefixDict;
        memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
        assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
        DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
        if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = input->size + 1;  /* auto-fix pledgedSrcSize */
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, 0 /*dictSize*/);


#ifdef ZSTD_MULTITHREAD
        if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
            params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
        }
        if (params.nbWorkers > 0) {
            /* mt context creation */
            if (cctx->mtctx == NULL) {
                DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                            params.nbWorkers);
                cctx->mtctx = ZSTDMT_createCCtx_advanced(params.nbWorkers, cctx->customMem);
                if (cctx->mtctx == NULL) return ERROR(memory_allocation);
            }
            /* mt compression */
            DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
            CHECK_F( ZSTDMT_initCStream_internal(
                        cctx->mtctx,
                        prefixDict.dict, prefixDict.dictSize, ZSTD_dct_rawContent,
                        cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) );
            cctx->streamStage = zcss_load;
            cctx->appliedParams.nbWorkers = params.nbWorkers;
        } else
#endif
        {   CHECK_F( ZSTD_resetCStream_internal(cctx,
                            prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                            cctx->cdict,
                            params, cctx->pledgedSrcSizePlusOne-1) );
            assert(cctx->streamStage == zcss_load);
            assert(cctx->appliedParams.nbWorkers == 0);
    }   }
    /* end of transparent initialization stage */

    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        {   size_t const flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
            return flushMin;
    }   }
#endif
    CHECK_F( ZSTD_compressStream_generic(cctx, output, input, endOp) );
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}